

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O3

int yang_check_deviate_mandatory(lys_deviate *deviate,lys_node *dev_target)

{
  ushort uVar1;
  LYS_NODE LVar2;
  long lVar3;
  int iVar4;
  char *pcVar5;
  lys_node *node;
  
  LVar2 = dev_target->nodetype;
  if ((LVar2 & (LYS_ANYDATA|LYS_LEAF|LYS_CHOICE)) == LYS_UNKNOWN) {
    ly_vlog(LYE_INSTMT,LY_VLOG_NONE,(void *)0x0,"mandatory");
    pcVar5 = "Target node does not allow \"mandatory\" property.";
  }
  else {
    uVar1 = dev_target->flags;
    if (deviate->mod == LY_DEVIATE_ADD) {
      if ((uVar1 & 0xc0) == 0) {
        if (LVar2 == LYS_CHOICE) {
          if (dev_target[1].dsc == (char *)0x0) goto LAB_0014d49d;
          ly_vlog(LYE_INCHILDSTMT,LY_VLOG_NONE,(void *)0x0,"mandatory","choice");
          pcVar5 = "The \"mandatory\" statement is forbidden on choices with \"default\".";
        }
        else {
          if ((LVar2 != LYS_LEAF) || (dev_target[1].prev == (lys_node *)0x0)) {
LAB_0014d49d:
            dev_target->flags = deviate->flags & 0xffc0 | uVar1 & 0xff3f;
            node = dev_target->parent;
            while( true ) {
              if (node == (lys_node *)0x0) {
                return 0;
              }
              LVar2 = node->nodetype;
              if ((LVar2 & (LYS_ACTION|LYS_GROUPING|LYS_CHOICE)) != LYS_UNKNOWN) break;
              if ((LVar2 == LYS_CONTAINER) &&
                 (lVar3._0_2_ = node[1].flags, lVar3._2_1_ = node[1].ext_size,
                 lVar3._3_1_ = node[1].iffeature_size, lVar3._4_1_ = node[1].padding[0],
                 lVar3._5_1_ = node[1].padding[1], lVar3._6_1_ = node[1].padding[2],
                 lVar3._7_1_ = node[1].padding[3], lVar3 != 0)) {
                return 0;
              }
              node = node->parent;
            }
            if (LVar2 != LYS_CHOICE) {
              return 0;
            }
            if (node[1].dsc != (char *)0x0) {
              iVar4 = lyp_check_mandatory_choice(node);
              if (iVar4 != 0) {
                return 1;
              }
              return 0;
            }
            return 0;
          }
          ly_vlog(LYE_INCHILDSTMT,LY_VLOG_NONE,(void *)0x0,"mandatory","leaf");
          pcVar5 = "The \"mandatory\" statement is forbidden on leaf with \"default\".";
        }
      }
      else {
        ly_vlog(LYE_INSTMT,LY_VLOG_NONE,(void *)0x0,"mandatory");
        pcVar5 = "Adding property that already exists.";
      }
    }
    else {
      if ((uVar1 & 0xc0) != 0) goto LAB_0014d49d;
      ly_vlog(LYE_INSTMT,LY_VLOG_NONE,(void *)0x0,"mandatory");
      pcVar5 = "Replacing a property that does not exist.";
    }
  }
  ly_vlog(LYE_SPEC,LY_VLOG_NONE,(void *)0x0,pcVar5);
  return 1;
}

Assistant:

int
yang_check_deviate_mandatory(struct lys_deviate *deviate, struct lys_node *dev_target)
{
    struct lys_node *parent;

    /* check target node type */
    if (!(dev_target->nodetype & (LYS_LEAF | LYS_CHOICE | LYS_ANYDATA))) {
        LOGVAL(LYE_INSTMT, LY_VLOG_NONE, NULL, "mandatory");
        LOGVAL(LYE_SPEC, LY_VLOG_NONE, NULL, "Target node does not allow \"mandatory\" property.");
        goto error;
    }

    if (deviate->mod == LY_DEVIATE_ADD) {
        /* check that there is no current value */
        if (dev_target->flags & LYS_MAND_MASK) {
            LOGVAL(LYE_INSTMT, LY_VLOG_NONE, NULL, "mandatory");
            LOGVAL(LYE_SPEC, LY_VLOG_NONE, NULL, "Adding property that already exists.");
            goto error;
        } else {
            if (dev_target->nodetype == LYS_LEAF && ((struct lys_node_leaf *)dev_target)->dflt) {
                /* RFC 6020, 7.6.4 - default statement must not with mandatory true */
                LOGVAL(LYE_INCHILDSTMT, LY_VLOG_NONE, NULL, "mandatory", "leaf");
                LOGVAL(LYE_SPEC, LY_VLOG_NONE, NULL, "The \"mandatory\" statement is forbidden on leaf with \"default\".");
                goto error;
            } else if (dev_target->nodetype == LYS_CHOICE && ((struct lys_node_choice *)dev_target)->dflt) {
                LOGVAL(LYE_INCHILDSTMT, LY_VLOG_NONE, NULL, "mandatory", "choice");
                LOGVAL(LYE_SPEC, LY_VLOG_NONE, NULL, "The \"mandatory\" statement is forbidden on choices with \"default\".");
                goto error;
            }
        }
    } else { /* replace */
        if (!(dev_target->flags & LYS_MAND_MASK)) {
            LOGVAL(LYE_INSTMT, LY_VLOG_NONE, NULL, "mandatory");
            LOGVAL(LYE_SPEC, LY_VLOG_NONE, NULL, "Replacing a property that does not exist.");
            goto error;
        }
    }

    /* remove current mandatory value of the target ... */
    dev_target->flags &= ~LYS_MAND_MASK;

    /* ... and replace it with the value specified in deviation */
    dev_target->flags |= deviate->flags & LYS_MAND_MASK;

    /* check for mandatory node in default case, first find the closest parent choice to the changed node */
    for (parent = dev_target->parent;
         parent && !(parent->nodetype & (LYS_CHOICE | LYS_GROUPING | LYS_ACTION));
         parent = parent->parent) {
        if (parent->nodetype == LYS_CONTAINER && ((struct lys_node_container *)parent)->presence) {
            /* stop also on presence containers */
            break;
        }
    }
    /* and if it is a choice with the default case, check it for presence of a mandatory node in it */
    if (parent && parent->nodetype == LYS_CHOICE && ((struct lys_node_choice *)parent)->dflt) {
        if (lyp_check_mandatory_choice(parent)) {
            goto error;
        }
    }

    return EXIT_SUCCESS;

error:
    return EXIT_FAILURE;
}